

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

Layer * __thiscall ncnn::Net::create_custom_layer(Net *this,int index)

{
  layer_creator_func p_Var1;
  size_type sVar2;
  reference pvVar3;
  uint in_ESI;
  long in_RDI;
  Layer *layer;
  layer_creator_func layer_creator;
  size_t custom_layer_registry_entry_count;
  Layer *local_8;
  
  sVar2 = std::
          vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
          ::size((vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                  *)(*(long *)(in_RDI + 0x48) + 0x98));
  if (((int)in_ESI < 0) || (sVar2 <= in_ESI)) {
    local_8 = (Layer *)0x0;
  }
  else {
    pvVar3 = std::
             vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
             ::operator[]((vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                           *)(*(long *)(in_RDI + 0x48) + 0x98),(long)(int)in_ESI);
    p_Var1 = pvVar3->creator;
    if (p_Var1 == (layer_creator_func)0x0) {
      local_8 = (Layer *)0x0;
    }
    else {
      pvVar3 = std::
               vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
               ::operator[]((vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                             *)(*(long *)(in_RDI + 0x48) + 0x98),(long)(int)in_ESI);
      local_8 = (*p_Var1)(pvVar3->userdata);
      local_8->typeindex = in_ESI | 0x100;
    }
  }
  return local_8;
}

Assistant:

Layer* Net::create_custom_layer(int index)
{
    const size_t custom_layer_registry_entry_count = d->custom_layer_registry.size();
    if (index < 0 || static_cast<unsigned int>(index) >= custom_layer_registry_entry_count)
        return 0;

    layer_creator_func layer_creator = d->custom_layer_registry[index].creator;
    if (!layer_creator)
        return 0;

    Layer* layer = layer_creator(d->custom_layer_registry[index].userdata);
    layer->typeindex = ncnn::LayerType::CustomBit | index;
    return layer;
}